

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_function_primitive_apply
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t argumentCount_00;
  bool bVar6;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  anon_struct_136_2_7a050327_for_gcRoots *paStack_f0;
  sysbvm_functionCallFrameStack_t local_e0;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = arguments[1];
  bVar6 = (uVar1 & 0xf) != 0;
  if (bVar6 || uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  if (uVar4 == 0) {
    argumentCount_00 = 0;
    uVar1 = 0;
  }
  else {
    if (bVar6 || uVar1 == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ulong *)(uVar1 + 8 + uVar4 * 8);
    }
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar1 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
    }
    else {
      uVar1 = 0;
    }
    argumentCount_00 = (uVar4 - 1) + uVar1;
  }
  memset(&local_e0,0,0xb0);
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 0x11;
  paStack_f0 = &local_e0.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_108);
  sysbvm_functionCallFrameStack_begin(context,&local_e0,*arguments,argumentCount_00,0);
  if (uVar4 != 0) {
    if (uVar4 != 1) {
      lVar3 = 0;
      do {
        uVar5 = arguments[1];
        if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
          sVar2 = *(sysbvm_tuple_t *)(uVar5 + 0x10 + lVar3 * 8);
        }
        else {
          sVar2 = 0;
        }
        sysbvm_functionCallFrameStack_push(&local_e0,sVar2);
        lVar3 = lVar3 + 1;
      } while (uVar4 - 1 != lVar3);
    }
    uVar5 = arguments[1];
    if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
      uVar4 = *(ulong *)(uVar5 + 8 + uVar4 * 8);
    }
    else {
      uVar4 = 0;
    }
    if (uVar1 != 0) {
      uVar5 = 0;
      do {
        if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
          sVar2 = *(sysbvm_tuple_t *)(uVar4 + 0x10 + uVar5 * 8);
        }
        else {
          sVar2 = 0;
        }
        sysbvm_functionCallFrameStack_push(&local_e0,sVar2);
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  sysbvm_stackFrame_popRecord(&local_108);
  sVar2 = sysbvm_function_apply
                    (context,local_e0.gcRoots.function,local_e0.expectedArgumentCount,
                     local_e0.gcRoots.applicationArguments,local_e0.applicationFlags);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_apply(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *argumentList = &arguments[1];

    size_t variadicArgumentCount = sysbvm_array_getSize(*argumentList);
    size_t argumentListSize = 0;
    size_t callArgumentCount = 0;
    if(variadicArgumentCount > 0)
    {
        argumentListSize = sysbvm_array_getSize(sysbvm_array_at(*argumentList, variadicArgumentCount - 1));
        callArgumentCount = variadicArgumentCount - 1 + argumentListSize;
    }

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, *function, callArgumentCount, 0);
    if(variadicArgumentCount > 0)
    {
        for(size_t i = 0; i < variadicArgumentCount - 1; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(*argumentList, i));
        
        sysbvm_tuple_t argumentArray = sysbvm_array_at(*argumentList, variadicArgumentCount - 1);
        for(size_t i = 0; i < argumentListSize; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(argumentArray, i));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}